

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mt19937.hpp
# Opt level: O0

basic_istream<wchar_t,_std::char_traits<wchar_t>_> *
trng::operator>>(basic_istream<wchar_t,_std::char_traits<wchar_t>_> *in,status_type *S)

{
  bool bVar1;
  fmtflags __fmtfl;
  _Ios_Fmtflags _Var2;
  basic_istream<wchar_t,_std::char_traits<wchar_t>_> *this;
  basic_istream<wchar_t,_std::char_traits<wchar_t>_> *pbVar3;
  uint *last;
  void *in_RSI;
  basic_istream<wchar_t,_std::char_traits<wchar_t>_> *in_RDI;
  fmtflags flags;
  status_type S_new;
  basic_istream<wchar_t,_std::char_traits<wchar_t>_> *in_00;
  io_range<unsigned_int_*> *in_stack_fffffffffffff5f8;
  undefined7 in_stack_fffffffffffff600;
  undefined1 in_stack_fffffffffffff607;
  status_type local_9d4;
  void *local_10;
  basic_istream<wchar_t,_std::char_traits<wchar_t>_> *local_8;
  
  local_10 = in_RSI;
  local_8 = in_RDI;
  mt19937::status_type::status_type(&local_9d4);
  __fmtfl = Catch::clara::std::ios_base::flags
                      ((ios_base *)(local_8 + *(long *)(*(long *)local_8 + -0x18)));
  this = local_8 + *(long *)(*(long *)local_8 + -0x18);
  _Var2 = Catch::clara::std::operator|(_S_dec,_S_fixed);
  _Var2 = Catch::clara::std::operator|(_Var2,_S_left);
  Catch::clara::std::ios_base::flags((ios_base *)this,_Var2);
  in_00 = local_8;
  utility::delim('\0');
  pbVar3 = utility::operator>>(in_00,(delim_c *)this);
  last = (uint *)std::wistream::operator>>((wistream *)pbVar3,&local_9d4.mti);
  utility::delim('\0');
  pbVar3 = utility::operator>>(in_00,(delim_c *)this);
  utility::make_io_range<unsigned_int*>((uint *)pbVar3,last,(char *)in_00);
  utility::operator>>((basic_istream<wchar_t,_std::char_traits<wchar_t>_> *)
                      CONCAT17(in_stack_fffffffffffff607,in_stack_fffffffffffff600),
                      in_stack_fffffffffffff5f8);
  utility::delim('\0');
  utility::operator>>(in_00,(delim_c *)this);
  bVar1 = std::wios::operator_cast_to_bool((wios *)(local_8 + *(long *)(*(long *)local_8 + -0x18)));
  if (bVar1) {
    memcpy(local_10,&local_9d4,0x9c4);
  }
  Catch::clara::std::ios_base::flags
            ((ios_base *)(local_8 + *(long *)(*(long *)local_8 + -0x18)),__fmtfl);
  return local_8;
}

Assistant:

std::basic_istream<char_t, traits_t> &operator>>(
          std::basic_istream<char_t, traits_t> &in, status_type &S) {
        status_type S_new;
        std::ios_base::fmtflags flags(in.flags());
        in.flags(std::ios_base::dec | std::ios_base::fixed | std::ios_base::left);
        in >> utility::delim('(') >> S_new.mti >> utility::delim(' ') >>
            utility::make_io_range(S_new.mt, S_new.mt + N, " ") >> utility::delim(')');
        if (in)
          S = S_new;
        in.flags(flags);
        return in;
      }